

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexCarePropagateBwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  uint uVar1;
  Abc_Cex_t *pCexMin;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Abc_Cex_t *pCex_00;
  int iVar5;
  ulong uVar6;
  ulong local_40;
  
  pCexMin = Abc_CexAlloc(pCex->nRegs,pCex->nPis,pCex->iFrame + 1);
  iVar4 = pCex->iFrame;
  pCexMin->iPo = pCex->iPo;
  pCexMin->iFrame = iVar4;
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar2 = Gia_ManCo(p,iVar4);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
  }
  iVar4 = pCex->iFrame;
  local_40 = 0x8000000000000000;
  do {
    if (iVar4 < 0) {
      return pCexMin;
    }
    iVar5 = 0;
    uVar6 = 0;
    if (iVar4 == pCex->iFrame) {
      uVar6 = local_40;
    }
    pGVar2 = Gia_ManPo(p,pCex->iPo);
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff | uVar6;
    for (; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5);
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar1 = Vec_IntEntry(vPriosFf,pCex->nRegs * iVar4 + iVar5);
      pGVar2->Value = uVar1;
    }
    pCex_00 = pCex;
    Bmc_CexCarePropagateFwdOne(p,pCex,iVar4,vPriosIn);
    Bmc_CexCarePropagateBwdOne(p,pCex_00,iVar4,pCexMin);
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pGVar2 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar5);
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0x7fffffffffffffff | *(ulong *)pGVar3 & 0x8000000000000000;
    }
    iVar4 = iVar4 + -1;
  } while( true );
}

Assistant:

Abc_Cex_t * Bmc_CexCarePropagateBwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Abc_Cex_t * pCexMin;
    Gia_Obj_t * pObjRo, * pObjRi;
    int f, i;
    pCexMin = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 );
    pCexMin->iPo    = pCex->iPo;
    pCexMin->iFrame = pCex->iFrame;
    Gia_ManForEachCo( p, pObjRi, i )
        pObjRi->fPhase = 0;
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Gia_ManPo(p, pCex->iPo)->fPhase = (int)(f == pCex->iFrame);
        Gia_ManForEachRo( p, pObjRo, i )
            pObjRo->Value = Vec_IntEntry( vPriosFf, f * pCex->nRegs + i );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
        Bmc_CexCarePropagateBwdOne( p, pCex, f, pCexMin );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRi->fPhase = pObjRo->fPhase;
    }
    return pCexMin;
}